

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

void google::protobuf::internal::SerializeMapEntry
               (FieldDescriptor *field,MapKey *key,MapValueRef *value,CodedOutputStream *output)

{
  FieldDescriptor *field_00;
  long lVar1;
  byte *pbVar2;
  bool bVar3;
  Type TVar4;
  uint32 uVar5;
  int32 iVar6;
  Descriptor *pDVar7;
  size_t sVar8;
  size_t sVar9;
  LogMessage *other;
  string *psVar10;
  uint64 uVar11;
  int64 iVar12;
  MessageLite *pMVar13;
  int iVar14;
  byte *pbVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  float value_00;
  double value_01;
  LogFinisher local_69;
  LogMessage local_68;
  
  pDVar7 = FieldDescriptor::message_type(field);
  field_00 = *(FieldDescriptor **)(pDVar7 + 0x30);
  pDVar7 = FieldDescriptor::message_type(field);
  uVar18 = *(int *)(field + 0x38) * 8 + 2;
  uVar17 = (ulong)uVar18;
  lVar1 = *(long *)(pDVar7 + 0x30);
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar18);
  }
  else {
    pbVar2 = output->buffer_;
    pbVar15 = pbVar2;
    if (0x7f < (uint)(*(int *)(field + 0x38) << 3)) {
      do {
        uVar18 = (uint)uVar17;
        *pbVar15 = (byte)uVar17 | 0x80;
        uVar17 = uVar17 >> 7;
        pbVar15 = pbVar15 + 1;
      } while (0x3fff < uVar18);
    }
    *pbVar15 = (byte)uVar17;
    iVar14 = ((int)pbVar15 - (int)pbVar2) + 1;
    output->buffer_ = output->buffer_ + iVar14;
    output->buffer_size_ = output->buffer_size_ - iVar14;
  }
  sVar8 = MapKeyDataOnlyByteSize(field_00,key);
  sVar9 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(lVar1 + 0xa8),value);
  uVar18 = (int)sVar9 + (int)sVar8 + 2;
  if (output->buffer_size_ < 5) {
    io::CodedOutputStream::WriteVarint32SlowPath(output,uVar18);
  }
  else {
    pbVar2 = output->buffer_;
    pbVar15 = pbVar2;
    uVar16 = uVar18;
    if (0x7f < uVar18) {
      do {
        *pbVar15 = (byte)uVar18 | 0x80;
        uVar16 = uVar18 >> 7;
        pbVar15 = pbVar15 + 1;
        bVar3 = 0x3fff < uVar18;
        uVar18 = uVar16;
      } while (bVar3);
    }
    *pbVar15 = (byte)uVar16;
    iVar14 = ((int)pbVar15 - (int)pbVar2) + 1;
    output->buffer_ = output->buffer_ + iVar14;
    output->buffer_size_ = output->buffer_size_ - iVar14;
  }
  TVar4 = FieldDescriptor::type(field_00);
  switch(TVar4) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x34e);
    other = LogMessage::operator<<(&local_68,"Unsupported");
    LogFinisher::operator=(&local_69,other);
    LogMessage::~LogMessage(&local_68);
    break;
  case TYPE_INT64:
    iVar12 = MapKey::GetInt64Value(key);
    WireFormatLite::WriteInt64(1,iVar12,output);
    break;
  case TYPE_UINT64:
    uVar11 = MapKey::GetUInt64Value(key);
    WireFormatLite::WriteUInt64(1,uVar11,output);
    break;
  case TYPE_INT32:
    iVar6 = MapKey::GetInt32Value(key);
    WireFormatLite::WriteInt32(1,iVar6,output);
    break;
  case TYPE_FIXED64:
    uVar11 = MapKey::GetUInt64Value(key);
    WireFormatLite::WriteFixed64(1,uVar11,output);
    break;
  case TYPE_FIXED32:
    uVar5 = MapKey::GetUInt32Value(key);
    WireFormatLite::WriteFixed32(1,uVar5,output);
    break;
  case TYPE_BOOL:
    bVar3 = MapKey::GetBoolValue(key);
    WireFormatLite::WriteBool(1,bVar3,output);
    break;
  case TYPE_STRING:
    psVar10 = MapKey::GetStringValue_abi_cxx11_(key);
    WireFormatLite::WriteString(1,psVar10,output);
    break;
  case TYPE_UINT32:
    uVar5 = MapKey::GetUInt32Value(key);
    WireFormatLite::WriteUInt32(1,uVar5,output);
    break;
  case TYPE_SFIXED32:
    iVar6 = MapKey::GetInt32Value(key);
    WireFormatLite::WriteSFixed32(1,iVar6,output);
    break;
  case TYPE_SFIXED64:
    iVar12 = MapKey::GetInt64Value(key);
    WireFormatLite::WriteSFixed64(1,iVar12,output);
    break;
  case TYPE_SINT32:
    iVar6 = MapKey::GetInt32Value(key);
    WireFormatLite::WriteSInt32(1,iVar6,output);
    break;
  case MAX_TYPE:
    iVar12 = MapKey::GetInt64Value(key);
    WireFormatLite::WriteSInt64(1,iVar12,output);
  }
  TVar4 = FieldDescriptor::type((FieldDescriptor *)(lVar1 + 0xa8));
  switch(TVar4) {
  case TYPE_DOUBLE:
    value_01 = MapValueRef::GetDoubleValue(value);
    WireFormatLite::WriteDouble(2,value_01,output);
    break;
  case TYPE_FLOAT:
    value_00 = MapValueRef::GetFloatValue(value);
    WireFormatLite::WriteFloat(2,value_00,output);
    break;
  case TYPE_INT64:
    iVar12 = MapValueRef::GetInt64Value(value);
    WireFormatLite::WriteInt64(2,iVar12,output);
    break;
  case TYPE_UINT64:
    uVar11 = MapValueRef::GetUInt64Value(value);
    WireFormatLite::WriteUInt64(2,uVar11,output);
    break;
  case TYPE_INT32:
    iVar6 = MapValueRef::GetInt32Value(value);
    WireFormatLite::WriteInt32(2,iVar6,output);
    break;
  case TYPE_FIXED64:
    uVar11 = MapValueRef::GetUInt64Value(value);
    WireFormatLite::WriteFixed64(2,uVar11,output);
    break;
  case TYPE_FIXED32:
    uVar5 = MapValueRef::GetUInt32Value(value);
    WireFormatLite::WriteFixed32(2,uVar5,output);
    break;
  case TYPE_BOOL:
    bVar3 = MapValueRef::GetBoolValue(value);
    WireFormatLite::WriteBool(2,bVar3,output);
    break;
  case TYPE_STRING:
    psVar10 = MapValueRef::GetStringValue_abi_cxx11_(value);
    WireFormatLite::WriteString(2,psVar10,output);
    break;
  case TYPE_GROUP:
    pMVar13 = &MapValueRef::GetMessageValue(value)->super_MessageLite;
    WireFormatLite::WriteGroup(2,pMVar13,output);
    break;
  case TYPE_MESSAGE:
    pMVar13 = &MapValueRef::GetMessageValue(value)->super_MessageLite;
    WireFormatLite::WriteMessage(2,pMVar13,output);
    break;
  case TYPE_BYTES:
    psVar10 = MapValueRef::GetStringValue_abi_cxx11_(value);
    WireFormatLite::WriteBytes(2,psVar10,output);
    break;
  case TYPE_UINT32:
    uVar5 = MapValueRef::GetUInt32Value(value);
    WireFormatLite::WriteUInt32(2,uVar5,output);
    break;
  case TYPE_ENUM:
    iVar14 = MapValueRef::GetEnumValue(value);
    WireFormatLite::WriteEnum(2,iVar14,output);
    break;
  case TYPE_SFIXED32:
    iVar6 = MapValueRef::GetInt32Value(value);
    WireFormatLite::WriteSFixed32(2,iVar6,output);
    break;
  case TYPE_SFIXED64:
    iVar12 = MapValueRef::GetInt64Value(value);
    WireFormatLite::WriteSFixed64(2,iVar12,output);
    break;
  case TYPE_SINT32:
    iVar6 = MapValueRef::GetInt32Value(value);
    WireFormatLite::WriteSInt32(2,iVar6,output);
    break;
  case MAX_TYPE:
    iVar12 = MapValueRef::GetInt64Value(value);
    WireFormatLite::WriteSInt64(2,iVar12,output);
  }
  return;
}

Assistant:

static void SerializeMapEntry(const FieldDescriptor* field, const MapKey& key,
                              const MapValueRef& value,
                              io::CodedOutputStream* output) {
  const FieldDescriptor* key_field = field->message_type()->field(0);
  const FieldDescriptor* value_field = field->message_type()->field(1);

  WireFormatLite::WriteTag(field->number(),
                           WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
  size_t size = kMapEntryTagByteSize;
  size += MapKeyDataOnlyByteSize(key_field, key);
  size += MapValueRefDataOnlyByteSize(value_field, value);
  output->WriteVarint32(size);
  SerializeMapKeyWithCachedSizes(key_field, key, output);
  SerializeMapValueRefWithCachedSizes(value_field, value, output);
}